

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::extAddPairwiseToSI32x4(Literal *__return_storage_ptr__,Literal *this)

{
  Type *other;
  int32_t iVar1;
  int32_t iVar2;
  Literal *in_RDX;
  Literal *this_00;
  long lVar3;
  Literal *this_01;
  undefined1 local_168 [8];
  LaneArray<4_*_2> lanes;
  LaneArray<4> result;
  
  this_01 = (Literal *)local_168;
  getLanes<short,8>((LaneArray<8> *)this_01,(wasm *)this,in_RDX);
  result._M_elems[3].field_0.i64 = 0;
  result._M_elems[3].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[2].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[2].type.id = 0;
  result._M_elems[1].type.id = 0;
  result._M_elems[2].field_0.i64 = 0;
  result._M_elems[1].field_0.i64 = 0;
  result._M_elems[1].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].field_0.func.super_IString.str._M_str = (char *)0x0;
  result._M_elems[0].type.id = 0;
  lanes._M_elems[7].type.id = 0;
  result._M_elems[0].field_0.i64 = 0;
  other = &result._M_elems[3].type;
  for (lVar3 = 0; lVar3 != 0x60; lVar3 = lVar3 + 0x18) {
    iVar1 = geti32(this_01);
    iVar2 = geti32(this_01 + 1);
    result._M_elems[3].type.id._0_4_ = (int)(short)iVar2 + (int)(short)iVar1;
    this_00 = (Literal *)((long)result._M_elems + lVar3 + -8);
    if (this_00 != (Literal *)other) {
      ~Literal(this_00);
      Literal(this_00,(Literal *)other);
    }
    ~Literal((Literal *)other);
    this_01 = this_01 + 2;
  }
  Literal(__return_storage_ptr__,(LaneArray<4> *)&lanes._M_elems[7].type);
  std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)&lanes._M_elems[7].type);
  std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_168);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::extAddPairwiseToSI32x4() const {
  return extAddPairwise<4, int16_t, int32_t>(*this);
}